

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# map.h
# Opt level: O1

void __thiscall
google::protobuf::internal::KeyMapBase<unsigned_int>::Resize
          (KeyMapBase<unsigned_int> *this,map_index_t new_num_buckets)

{
  NodeBase **ppNVar1;
  Nonnull<const_char_*> pcVar2;
  
  if (new_num_buckets < 2) {
    pcVar2 = absl::lts_20250127::log_internal::MakeCheckOpString<long,long>
                       ((ulong)new_num_buckets,2,"new_num_buckets >= kMinTableSize");
  }
  else {
    pcVar2 = (Nonnull<const_char_*>)0x0;
  }
  if (pcVar2 == (Nonnull<const_char_*>)0x0) {
    if ((new_num_buckets ^ new_num_buckets - 1) <= new_num_buckets - 1) {
      Resize((KeyMapBase<unsigned_int> *)&stack0xffffffffffffffe0);
    }
    if ((this->super_UntypedMapBase).num_buckets_ == 1) {
      (this->super_UntypedMapBase).index_of_first_non_null_ = new_num_buckets;
      (this->super_UntypedMapBase).num_buckets_ = new_num_buckets;
      ppNVar1 = UntypedMapBase::CreateEmptyTable(&this->super_UntypedMapBase,new_num_buckets);
      (this->super_UntypedMapBase).table_ = ppNVar1;
    }
    else {
      if (new_num_buckets < 2) {
        pcVar2 = absl::lts_20250127::log_internal::MakeCheckOpString<long,long>
                           ((ulong)new_num_buckets,2,"new_num_buckets >= kMinTableSize");
      }
      else {
        pcVar2 = (Nonnull<const_char_*>)0x0;
      }
      if (pcVar2 != (Nonnull<const_char_*>)0x0) goto LAB_00456ca8;
      Resize();
    }
    return;
  }
  Resize();
LAB_00456ca8:
  Resize();
}

Assistant:

void Resize(map_index_t new_num_buckets) {
    ABSL_DCHECK_GE(new_num_buckets, kMinTableSize);
    ABSL_DCHECK(absl::has_single_bit(new_num_buckets));
    if (num_buckets_ == kGlobalEmptyTableSize) {
      // This is the global empty array.
      // Just overwrite with a new one. No need to transfer or free anything.
      num_buckets_ = index_of_first_non_null_ = new_num_buckets;
      table_ = CreateEmptyTable(num_buckets_);
      return;
    }

    ABSL_DCHECK_GE(new_num_buckets, kMinTableSize);
    const auto old_table = table_;
    const map_index_t old_table_size = num_buckets_;
    num_buckets_ = new_num_buckets;
    table_ = CreateEmptyTable(num_buckets_);
    const map_index_t start = index_of_first_non_null_;
    index_of_first_non_null_ = num_buckets_;
    for (map_index_t i = start; i < old_table_size; ++i) {
      for (KeyNode* node = static_cast<KeyNode*>(old_table[i]);
           node != nullptr;) {
        auto* next = static_cast<KeyNode*>(node->next);
        InsertUnique(BucketNumber(TS::ToView(node->key())), node);
        node = next;
      }
    }
    DeleteTable(old_table, old_table_size);
    AssertLoadFactor();
  }